

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O0

size_t build_query(char *buf,size_t size,uint16_t qtype,char *dn,int edns)

{
  uint16_t uVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  uint16_t *puVar6;
  char *t;
  char *p;
  size_t rc;
  dns_header_t *hdr;
  char *pcStack_28;
  int edns_local;
  char *dn_local;
  uint16_t qtype_local;
  size_t size_local;
  char *buf_local;
  
  sVar2 = strlen(dn);
  lVar3 = 0;
  if (edns != 0) {
    lVar3 = 0xb;
  }
  uVar4 = lVar3 + sVar2 + 0x12;
  if ((buf != (char *)0x0) && (uVar4 <= size)) {
    dns_init_query((dns_header_t *)buf);
    t = buf + 0xc;
    uVar1 = ntohs(*(uint16_t *)(buf + 4));
    uVar1 = htons(uVar1 + 1);
    *(uint16_t *)(buf + 4) = uVar1;
    pcStack_28 = dn;
    while (pcVar5 = strchr(pcStack_28,0x2e), pcVar5 != (char *)0x0) {
      *t = (char)pcVar5 - (char)pcStack_28;
      memcpy(t + 1,pcStack_28,(long)pcVar5 - (long)pcStack_28);
      t = t + 1 + ((long)pcVar5 - (long)pcStack_28);
      pcStack_28 = pcVar5 + 1;
    }
    sVar2 = strlen(pcStack_28);
    *t = (char)sVar2;
    strcpy(t + 1,pcStack_28);
    sVar2 = strlen(pcStack_28);
    puVar6 = (uint16_t *)(t + 1 + sVar2 + 1);
    uVar1 = htons(qtype);
    *puVar6 = uVar1;
    uVar1 = htons(1);
    puVar6[1] = uVar1;
    t = (char *)(puVar6 + 2);
    if (edns != 0) {
      uVar1 = ntohs(*(uint16_t *)(buf + 10));
      uVar1 = htons(uVar1 + 1);
      *(uint16_t *)(buf + 10) = uVar1;
      *(undefined8 *)t = 0x10290000;
      puVar6[6] = 0;
      *(undefined1 *)(puVar6 + 7) = 0;
      t = (char *)((long)puVar6 + 0xf);
    }
    if ((long)t - (long)buf != uVar4) {
      __assert_fail("p - buf == rc",
                    "/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/dns.c",
                    0x13b,"size_t build_query(char *, size_t, uint16_t, const char *, int)");
    }
  }
  return uVar4;
}

Assistant:

static size_t build_query(char * buf, size_t size, uint16_t qtype, const char * dn, int edns)
{
    struct dns_header_t * hdr = (struct dns_header_t *)buf;
    size_t rc = sizeof(struct dns_header_t)
                + sizeof(uint16_t) // QTYPE
                + sizeof(uint16_t) // QCLASS
                + strlen(dn) + 2;
    rc += (edns ? sizeof(edns_opt) : 0);

    char * p = buf;
    if (buf && size >= rc) {
        dns_init_query((struct dns_header_t *)p);
        p += sizeof(struct dns_header_t);
        hdr->qdcount = htons(ntohs(hdr->qdcount) + 1);
        for (;;) {
           char * t = strchr(dn, '.');
           if (!t) {
               *p = (char)(strlen(dn));
               p += 1;
               strcpy(p, dn);
               p += strlen(dn) + 1;
               break;
           }
           else {
               *p = (char)(t - dn);
               p += 1;
               memcpy(p, dn, (t - dn));
               p += t - dn;
               dn = t + 1;
           }
        }
        *(uint16_t *)p = htons(qtype);
        p += sizeof(uint16_t);
        *(uint16_t *)p = htons(CLASS_IN);
        p += sizeof(uint16_t);
        // Add EDNS OPT as additional resource if required
        if (edns) {
            hdr->arcount = htons(ntohs(hdr->arcount) + 1);
            memcpy(p, edns_opt, sizeof(edns_opt));
            p += sizeof(edns_opt);
        }
        assert(p - buf == rc);
    }
    return rc;
}